

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O1

void __thiscall ki::protocol::net::ClientSession::on_keep_alive(ClientSession *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  ServerKeepAlive data;
  ServerKeepAlive keep_alive;
  ServerKeepAlive local_30;
  ServerKeepAlive local_20;
  
  control::ServerKeepAlive::ServerKeepAlive(&local_20,0);
  p_Var1 = this->_vptr_ClientSession[-3];
  control::ServerKeepAlive::ServerKeepAlive(&local_30,0);
  control::ServerKeepAlive::read_from(&local_30,(istream *)(&this->field_0x40 + (long)p_Var1));
  local_20.m_timestamp = local_30.m_timestamp;
  uVar3 = std::chrono::_V2::steady_clock::now();
  pp_Var2 = this->_vptr_ClientSession;
  *(undefined8 *)(&this->field_0x28 + (long)pp_Var2[-3]) = uVar3;
  Session::send_packet
            ((Session *)((long)&this->_vptr_ClientSession + (long)pp_Var2[-3]),true,'\x04',
             &local_20.super_Serializable);
  return;
}

Assistant:

void ClientSession::on_keep_alive()
	{
		// Read the payload data into a structure
		control::ServerKeepAlive keep_alive;
		try
		{
			keep_alive = read_data<control::ServerKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Send the response
		m_last_received_heartbeat_time = std::chrono::steady_clock::now();
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE_RSP, keep_alive);
	}